

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

void __thiscall
duckdb::Relation::Insert(Relation *this,vector<duckdb::vector<duckdb::Value,_true>,_true> *values)

{
  ValueRelation *this_00;
  shared_ptr<duckdb::ValueRelation,_true> rel;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  undefined1 local_69;
  undefined1 local_68 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined1 local_48 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_28;
  
  local_28.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->(&this->context);
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_68);
  local_48._0_8_ = (ValueRelation *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ValueRelation,std::allocator<duckdb::ValueRelation>,duckdb::shared_ptr<duckdb::ClientContext,true>,duckdb::vector<duckdb::vector<duckdb::Value,true>,true>const&,duckdb::vector<std::__cxx11::string,true>,char_const(&)[7]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8),(ValueRelation **)local_48
             ,(allocator<duckdb::ValueRelation> *)&local_69,
             (shared_ptr<duckdb::ClientContext,_true> *)local_68,values,&local_28,
             (char (*) [7])0x1e4b182);
  shared_ptr<duckdb::ValueRelation,_true>::shared_ptr
            ((shared_ptr<duckdb::ValueRelation,_true> *)(local_68 + 0x10),
             (shared_ptr<duckdb::ValueRelation> *)local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  this_00 = shared_ptr<duckdb::ValueRelation,_true>::operator->
                      ((shared_ptr<duckdb::ValueRelation,_true> *)(local_68 + 0x10));
  (*this->_vptr_Relation[5])(local_48,this);
  Insert(&this_00->super_Relation,(string *)local_48);
  if ((ValueRelation *)local_48._0_8_ != (ValueRelation *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_28);
  return;
}

Assistant:

void Relation::Insert(const vector<vector<Value>> &values) {
	vector<string> column_names;
	auto rel = make_shared_ptr<ValueRelation>(context->GetContext(), values, std::move(column_names), "values");
	rel->Insert(GetAlias());
}